

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O2

void __thiscall RVO::Agent::insertObstacleNeighbor(Agent *this,Obstacle *obstacle,float rangeSq)

{
  pointer ppVar1;
  Obstacle **ppOVar2;
  long lVar3;
  float fVar4;
  pair<float,_const_RVO::Obstacle_*> local_20;
  
  fVar4 = distSqPointLineSegment
                    (&obstacle->point_,&obstacle->nextObstacle_->point_,&this->position_);
  if (fVar4 < rangeSq) {
    local_20.first = fVar4;
    local_20.second = obstacle;
    std::
    vector<std::pair<float,RVO::Obstacle_const*>,std::allocator<std::pair<float,RVO::Obstacle_const*>>>
    ::emplace_back<std::pair<float,RVO::Obstacle_const*>>
              ((vector<std::pair<float,RVO::Obstacle_const*>,std::allocator<std::pair<float,RVO::Obstacle_const*>>>
                *)&this->obstacleNeighbors_,&local_20);
    ppVar1 = (this->obstacleNeighbors_).
             super__Vector_base<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar3 = (long)ppVar1 -
            (long)(this->obstacleNeighbors_).
                  super__Vector_base<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    for (ppOVar2 = &ppVar1[-1].second;
        (lVar3 = lVar3 + -1, lVar3 != 0 && (fVar4 < *(float *)(ppOVar2 + -3)));
        ppOVar2 = ppOVar2 + -2) {
      ((pair<float,_const_RVO::Obstacle_*> *)(ppOVar2 + -1))->first = *(float *)(ppOVar2 + -3);
      *ppOVar2 = ppOVar2[-2];
    }
    ((pair<float,_const_RVO::Obstacle_*> *)(ppOVar2 + -1))->first = fVar4;
    *ppOVar2 = obstacle;
  }
  return;
}

Assistant:

void Agent::insertObstacleNeighbor(const Obstacle *obstacle, float rangeSq)
	{
		const Obstacle *const nextObstacle = obstacle->nextObstacle_;

		const float distSq = distSqPointLineSegment(obstacle->point_, nextObstacle->point_, position_);

		if (distSq < rangeSq) {
			obstacleNeighbors_.push_back(std::make_pair(distSq, obstacle));

			size_t i = obstacleNeighbors_.size() - 1;

			while (i != 0 && distSq < obstacleNeighbors_[i - 1].first) {
				obstacleNeighbors_[i] = obstacleNeighbors_[i - 1];
				--i;
			}

			obstacleNeighbors_[i] = std::make_pair(distSq, obstacle);
		}
	}